

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9Put(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  Abc_Ntk_t *pNtk;
  Abc_Obj_t *pAVar7;
  Gia_Man_t *pGVar8;
  Aig_Man_t *pAVar9;
  Abc_Ntk_t *pNtkOld;
  char *pcVar10;
  char *pcVar11;
  int i;
  float fVar12;
  float fVar13;
  uint local_a0;
  char pSuffix [100];
  
  Abc_FrameReadNtk(pAbc);
  local_a0 = 0;
  Extra_UtilGetoptReset();
  bVar4 = true;
  bVar2 = false;
  bVar3 = false;
  while( true ) {
    while (iVar5 = Extra_UtilGetopt(argc,argv,"seovh"), iVar5 == 0x73) {
      bVar4 = (bool)(bVar4 ^ 1);
    }
    if (iVar5 == -1) break;
    if (iVar5 == 0x65) {
      bVar2 = (bool)(bVar2 ^ 1);
    }
    else if (iVar5 == 0x6f) {
      local_a0 = local_a0 ^ 1;
    }
    else {
      if (iVar5 != 0x76) {
        iVar5 = -2;
        Abc_Print(-2,"usage: &put [-seovh]\n");
        Abc_Print(-2,"\t         transfer the current network into the old ABC\n");
        pcVar11 = "yes";
        pcVar10 = "yes";
        if (!bVar4) {
          pcVar10 = "no";
        }
        Abc_Print(-2,"\t-s     : toggle clearning verification status [default = %s]\n",pcVar10);
        pcVar10 = "yes";
        if (!bVar2) {
          pcVar10 = "no";
        }
        Abc_Print(-2,"\t-e     : toggle extracting MUXes for flop enables [default = %s]\n",pcVar10)
        ;
        pcVar10 = "yes";
        if (local_a0 == 0) {
          pcVar10 = "no";
        }
        Abc_Print(-2,
                  "\t-o     : toggles using buffers to decouple combinational outputs [default = %s]\n"
                  ,pcVar10);
        if (!bVar3) {
          pcVar11 = "no";
        }
        Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar11);
        pcVar10 = "\t-h     : print the command usage\n";
LAB_002449db:
        Abc_Print(iVar5,pcVar10);
        return 1;
      }
      bVar3 = (bool)(bVar3 ^ 1);
    }
  }
  pGVar8 = pAbc->pGia;
  if (pGVar8 != (Gia_Man_t *)0x0) {
    if (bVar2) {
      iVar5 = 1;
    }
    else {
      if (pGVar8->vCellMapping != (Vec_Int_t *)0x0) {
        pNtk = Abc_NtkFromCellMappedGia(pGVar8,local_a0);
        goto LAB_00244a04;
      }
      if ((pGVar8->vMapping == (Vec_Int_t *)0x0) && (pGVar8->pMuxes == (uint *)0x0)) {
        iVar5 = Gia_ManHasDangling(pGVar8);
        pAVar9 = Gia_ManToAig(pAbc->pGia,0);
        pNtkOld = Abc_NtkFromAigPhase(pAVar9);
        pcVar10 = Extra_UtilStrsav(pAVar9->pName);
        pNtkOld->pName = pcVar10;
        Aig_ManStop(pAVar9);
        pNtk = pNtkOld;
        if (iVar5 != 0) {
          pAVar9 = Gia_ManToAig(pAbc->pGia,1);
          pNtk = Abc_NtkFromDarChoices(pNtkOld,pAVar9);
          Abc_NtkDelete(pNtkOld);
          Aig_ManStop(pAVar9);
        }
        goto LAB_00244a04;
      }
      iVar5 = 0;
    }
    pNtk = Abc_NtkFromMappedGia(pGVar8,iVar5,local_a0);
LAB_00244a04:
    pGVar8 = pAbc->pGia;
    if (pGVar8->vNamesIn != (Vec_Ptr_t *)0x0) {
      for (iVar5 = 0; iVar5 < pNtk->vCis->nSize; iVar5 = iVar5 + 1) {
        pAVar7 = Abc_NtkCi(pNtk,iVar5);
        if (iVar5 < pAbc->pGia->vNamesIn->nSize) {
          Nm_ManDeleteIdName(pNtk->pManName,pAVar7->Id);
          pcVar10 = (char *)Vec_PtrEntry(pAbc->pGia->vNamesIn,iVar5);
          Abc_ObjAssignName(pAVar7,pcVar10,(char *)0x0);
        }
      }
      pGVar8 = pAbc->pGia;
    }
    if (pGVar8->vNamesOut != (Vec_Ptr_t *)0x0) {
      uVar6 = Abc_Base10Log(pNtk->nObjCounts[8]);
      for (iVar5 = 0; iVar5 < pNtk->vCos->nSize; iVar5 = iVar5 + 1) {
        pAVar7 = Abc_NtkCo(pNtk,iVar5);
        if (iVar5 < pAbc->pGia->vNamesOut->nSize) {
          Nm_ManDeleteIdName(pNtk->pManName,pAVar7->Id);
          if ((*(uint *)&pAVar7->field_0x14 & 0xf) == 3) {
            pcVar11 = (char *)Vec_PtrEntry(pAbc->pGia->vNamesOut,iVar5);
            pcVar10 = (char *)0x0;
          }
          else {
            if (iVar5 < pNtk->vPos->nSize) {
              __assert_fail("i >= Abc_NtkPoNum(pNtk)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abc.c"
                            ,0x7703,"int Abc_CommandAbc9Put(Abc_Frame_t *, int, char **)");
            }
            sprintf(pSuffix,"_li%0*d",(ulong)uVar6);
            pcVar11 = (char *)Vec_PtrEntry(pAbc->pGia->vNamesOut,iVar5);
            pcVar10 = pSuffix;
          }
          Abc_ObjAssignName(pAVar7,pcVar11,pcVar10);
        }
      }
      pGVar8 = pAbc->pGia;
    }
    if ((pGVar8->vNamesIn != (Vec_Ptr_t *)0x0) || (pGVar8->vNamesOut != (Vec_Ptr_t *)0x0)) {
      Abc_NtkRedirectCiCo(pNtk);
      pGVar8 = pAbc->pGia;
    }
    if ((pGVar8->vInArrs != (Vec_Flt_t *)0x0) || (pGVar8->vOutReqs != (Vec_Flt_t *)0x0)) {
      iVar5 = 0;
      Abc_NtkTimeInitialize(pNtk,(Abc_Ntk_t *)0x0);
      fVar12 = pAbc->pGia->DefInArrs;
      Abc_NtkTimeSetDefaultArrival(pNtk,fVar12,fVar12);
      fVar12 = pAbc->pGia->DefOutReqs;
      Abc_NtkTimeSetDefaultRequired(pNtk,fVar12,fVar12);
      pGVar8 = pAbc->pGia;
      if (pGVar8->vInArrs != (Vec_Flt_t *)0x0) {
        for (; iVar5 < pNtk->vCis->nSize; iVar5 = iVar5 + 1) {
          pAVar7 = Abc_NtkCi(pNtk,iVar5);
          iVar1 = pAVar7->Id;
          fVar12 = Vec_FltEntry(pAbc->pGia->vInArrs,iVar5);
          fVar13 = Vec_FltEntry(pAbc->pGia->vInArrs,iVar5);
          Abc_NtkTimeSetArrival(pNtk,iVar1,fVar12,fVar13);
        }
        pGVar8 = pAbc->pGia;
      }
      if (pGVar8->vOutReqs != (Vec_Flt_t *)0x0) {
        for (iVar5 = 0; iVar5 < pNtk->vCos->nSize; iVar5 = iVar5 + 1) {
          pAVar7 = Abc_NtkCo(pNtk,iVar5);
          iVar1 = pAVar7->Id;
          fVar12 = Vec_FltEntry(pAbc->pGia->vOutReqs,iVar5);
          fVar13 = Vec_FltEntry(pAbc->pGia->vOutReqs,iVar5);
          Abc_NtkTimeSetRequired(pNtk,iVar1,fVar12,fVar13);
        }
      }
    }
    Abc_FrameReplaceCurrentNetwork(pAbc,pNtk);
    if (!bVar4) {
      return 0;
    }
    Abc_FrameClearVerifStatus(pAbc);
    return 0;
  }
  pcVar10 = "Empty network.\n";
  iVar5 = -1;
  goto LAB_002449db;
}

Assistant:

int Abc_CommandAbc9Put( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Abc_Ntk_t * Abc_NtkFromDarChoices( Abc_Ntk_t * pNtkOld, Aig_Man_t * pMan );
    extern void Abc_NtkRedirectCiCo( Abc_Ntk_t * pNtk );
    extern Abc_Ntk_t * Abc_NtkFromCellMappedGia( Gia_Man_t * p, int fUseBuffs );
    extern Abc_Ntk_t * Abc_NtkFromMappedGia( Gia_Man_t * p, int fFindEnables, int fUseBuffs );

    Aig_Man_t * pMan;
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int fStatusClear = 1;
    int fFindEnables = 0;
    int fUseBuffs    = 0;
    int c, fVerbose  = 0;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "seovh" ) ) != EOF )
    {
        switch ( c )
        {
        case 's':
            fStatusClear ^= 1;
            break;
        case 'e':
            fFindEnables ^= 1;
            break;
        case 'o':
            fUseBuffs ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( fFindEnables )
        pNtk = Abc_NtkFromMappedGia( pAbc->pGia, 1, fUseBuffs );
    else if ( Gia_ManHasCellMapping(pAbc->pGia) )
        pNtk = Abc_NtkFromCellMappedGia( pAbc->pGia, fUseBuffs );
    else if ( Gia_ManHasMapping(pAbc->pGia) || pAbc->pGia->pMuxes )
        pNtk = Abc_NtkFromMappedGia( pAbc->pGia, 0, fUseBuffs );
    else if ( Gia_ManHasDangling(pAbc->pGia) == 0 )
    {
        pMan = Gia_ManToAig( pAbc->pGia, 0 );
        pNtk = Abc_NtkFromAigPhase( pMan );
        pNtk->pName = Extra_UtilStrsav(pMan->pName);
        Aig_ManStop( pMan );
    }
    else
    {
        Abc_Ntk_t * pNtkNoCh;
//        Abc_Print( -1, "Transforming AIG with %d choice nodes.\n", Gia_ManEquivCountClasses(pAbc->pGia) );
        // create network without choices
        pMan = Gia_ManToAig( pAbc->pGia, 0 );
        pNtkNoCh = Abc_NtkFromAigPhase( pMan );
        pNtkNoCh->pName = Extra_UtilStrsav(pMan->pName);
        Aig_ManStop( pMan );
        // derive network with choices
        pMan = Gia_ManToAig( pAbc->pGia, 1 );
        pNtk = Abc_NtkFromDarChoices( pNtkNoCh, pMan );
        Abc_NtkDelete( pNtkNoCh );
        Aig_ManStop( pMan );
    }
    // transfer PI names to pNtk
    if ( pAbc->pGia->vNamesIn )
    {
        Abc_Obj_t * pObj;
        int i;
        Abc_NtkForEachCi( pNtk, pObj, i ) {
            if (i < Vec_PtrSize(pAbc->pGia->vNamesIn)) {
                Nm_ManDeleteIdName(pNtk->pManName, pObj->Id);
                Abc_ObjAssignName( pObj, (char *)Vec_PtrEntry(pAbc->pGia->vNamesIn, i), NULL );
            }
        }
    }
    // transfer PO names to pNtk
    if ( pAbc->pGia->vNamesOut )
    {
        char pSuffix[100];
        Abc_Obj_t * pObj;
        int i, nDigits = Abc_Base10Log( Abc_NtkLatchNum(pNtk) );
        Abc_NtkForEachCo( pNtk, pObj, i ) {
            if (i < Vec_PtrSize(pAbc->pGia->vNamesOut)) {
                Nm_ManDeleteIdName(pNtk->pManName, pObj->Id);
                if ( Abc_ObjIsPo(pObj) )
                    Abc_ObjAssignName( pObj, (char *)Vec_PtrEntry(pAbc->pGia->vNamesOut, i), NULL );
                else
                {
                    assert( i >= Abc_NtkPoNum(pNtk) );
                    sprintf( pSuffix, "_li%0*d", nDigits, i-Abc_NtkPoNum(pNtk) );
                    Abc_ObjAssignName( pObj, (char *)Vec_PtrEntry(pAbc->pGia->vNamesOut, i), pSuffix );
                }
            }
        }
    }

    // decouple CI/CO with the same name
    if ( pAbc->pGia->vNamesIn || pAbc->pGia->vNamesOut )
        Abc_NtkRedirectCiCo( pNtk );

    // transfer timing information
    if ( pAbc->pGia->vInArrs || pAbc->pGia->vOutReqs )
    {
        Abc_Obj_t * pObj; int i;
        Abc_NtkTimeInitialize( pNtk, NULL );
        Abc_NtkTimeSetDefaultArrival( pNtk, pAbc->pGia->DefInArrs, pAbc->pGia->DefInArrs );
        Abc_NtkTimeSetDefaultRequired( pNtk, pAbc->pGia->DefOutReqs, pAbc->pGia->DefOutReqs );
        if ( pAbc->pGia->vInArrs )
            Abc_NtkForEachCi( pNtk, pObj, i )
                Abc_NtkTimeSetArrival( pNtk, Abc_ObjId(pObj), Vec_FltEntry(pAbc->pGia->vInArrs, i), Vec_FltEntry(pAbc->pGia->vInArrs, i) );
        if ( pAbc->pGia->vOutReqs )
            Abc_NtkForEachCo( pNtk, pObj, i )
                Abc_NtkTimeSetRequired( pNtk, Abc_ObjId(pObj), Vec_FltEntry(pAbc->pGia->vOutReqs, i), Vec_FltEntry(pAbc->pGia->vOutReqs, i) );
    }

    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtk );
    if ( fStatusClear )
        Abc_FrameClearVerifStatus( pAbc );
    return 0;

usage:
    Abc_Print( -2, "usage: &put [-seovh]\n" );
    Abc_Print( -2, "\t         transfer the current network into the old ABC\n" );
    Abc_Print( -2, "\t-s     : toggle clearning verification status [default = %s]\n", fStatusClear? "yes": "no" );
    Abc_Print( -2, "\t-e     : toggle extracting MUXes for flop enables [default = %s]\n", fFindEnables? "yes": "no" );
    Abc_Print( -2, "\t-o     : toggles using buffers to decouple combinational outputs [default = %s]\n", fUseBuffs? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}